

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_reader.cc
# Opt level: O0

void __thiscall lf::io::GmshReader::InitGmshFile(GmshReader *this,GMshFileV4 *msh_file)

{
  allocator<bool> *this_00;
  allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *this_01;
  value_type vVar1;
  size_t sVar2;
  Entity *e_00;
  initializer_list<unsigned_long> __l;
  value_type *pvVar3;
  value_type *pvVar4;
  value_type *pvVar5;
  value_type *pvVar6;
  bool bVar7;
  RefElType RVar8;
  RefElType RVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  size_type sVar13;
  dim_t dVar14;
  uint uVar15;
  pointer pMVar16;
  runtime_error *prVar17;
  size_type sVar18;
  vector<lf::io::GMshFileV4::ElementBlock,_std::allocator<lf::io::GMshFileV4::ElementBlock>_>
  *this_02;
  vector<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *this_03;
  reference pvVar19;
  reference pvVar20;
  ostream *poVar21;
  value_type *pvVar22;
  value_type *pvVar23;
  reference this_04;
  CoeffReturnType pdVar24;
  value_type *pvVar25;
  const_reference pvVar26;
  value_type *pvVar27;
  const_reference pvVar28;
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar29;
  const_reference pvVar30;
  const_reference pvVar31;
  reference pvVar32;
  __tuple_element_t<0UL,_tuple<vector<PointEntity,_allocator<PointEntity>_>,_vector<Entity,_allocator<Entity>_>,_vector<Entity,_allocator<Entity>_>,_vector<Entity,_allocator<Entity>_>_>_>
  *entities;
  __tuple_element_t<1UL,_tuple<vector<PointEntity,_allocator<PointEntity>_>,_vector<Entity,_allocator<Entity>_>,_vector<Entity,_allocator<Entity>_>,_vector<Entity,_allocator<Entity>_>_>_>
  *entities_00;
  __tuple_element_t<2UL,_tuple<vector<PointEntity,_allocator<PointEntity>_>,_vector<Entity,_allocator<Entity>_>,_vector<Entity,_allocator<Entity>_>,_vector<Entity,_allocator<Entity>_>_>_>
  *entities_01;
  __tuple_element_t<3UL,_tuple<vector<PointEntity,_allocator<PointEntity>_>,_vector<Entity,_allocator<Entity>_>,_vector<Entity,_allocator<Entity>_>,_vector<Entity,_allocator<Entity>_>_>_>
  *entities_02;
  __tuple_element_t<0UL,_tuple<vector<PartitionedPointEntity,_allocator<PartitionedPointEntity>_>,_vector<PartitionedEntity,_allocator<PartitionedEntity>_>,_vector<PartitionedEntity,_allocator<PartitionedEntity>_>,_vector<PartitionedEntity,_allocator<PartitionedEntity>_>_>_>
  *entities_03;
  __tuple_element_t<1UL,_tuple<vector<PartitionedPointEntity,_allocator<PartitionedPointEntity>_>,_vector<PartitionedEntity,_allocator<PartitionedEntity>_>,_vector<PartitionedEntity,_allocator<PartitionedEntity>_>,_vector<PartitionedEntity,_allocator<PartitionedEntity>_>_>_>
  *entities_04;
  __tuple_element_t<2UL,_tuple<vector<PartitionedPointEntity,_allocator<PartitionedPointEntity>_>,_vector<PartitionedEntity,_allocator<PartitionedEntity>_>,_vector<PartitionedEntity,_allocator<PartitionedEntity>_>,_vector<PartitionedEntity,_allocator<PartitionedEntity>_>_>_>
  *entities_05;
  __tuple_element_t<3UL,_tuple<vector<PartitionedPointEntity,_allocator<PartitionedPointEntity>_>,_vector<PartitionedEntity,_allocator<PartitionedEntity>_>,_vector<PartitionedEntity,_allocator<PartitionedEntity>_>,_vector<PartitionedEntity,_allocator<PartitionedEntity>_>_>_>
  *entities_06;
  element_type *peVar33;
  undefined4 extraout_var;
  reference ppEVar34;
  ulong uVar35;
  reference this_05;
  iterator __first;
  iterator __last;
  element_type *this_06;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_07;
  vector<lf::io::GMshFileV4::PhysicalName,_std::allocator<lf::io::GMshFileV4::PhysicalName>_>
  *this_08;
  string *__x;
  int *__x_00;
  pair<unsigned_long,_unsigned_long> pVar36;
  reference rVar37;
  uint local_167c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_1678;
  pair<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  local_1650;
  _Base_ptr local_1620;
  uint local_1614;
  pair<int,_unsigned_int> local_1610;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_unsigned_int>_>
  local_1608;
  reference local_15e0;
  PhysicalName *pn;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<lf::io::GMshFileV4::PhysicalName,_std::allocator<lf::io::GMshFileV4::PhysicalName>_>
  *__range2_1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_15a8;
  const_iterator local_15a0;
  reference local_1598;
  value_type *physical_tags;
  value_type *element_block_1;
  unsigned_long *gmsh_index;
  iterator __end5;
  iterator __begin5;
  value_type *__range5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> temp;
  size_type mi_1;
  Entity *e;
  iterator __end3;
  iterator __begin3;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3;
  undefined1 local_1510 [4];
  dim_t c_1;
  shared_ptr<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_1500;
  undefined1 local_14e9;
  undefined1 local_14e8 [7];
  anon_class_1_0_00000001 makeMap;
  array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
  gmei2gmphi;
  allocator<unsigned_long> local_1471;
  value_type *local_1470;
  value_type **local_1468;
  size_type local_1460;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1458;
  span<const_unsigned_int,_18446744073709551615UL> local_1440;
  RefElType local_1429;
  uint local_1428;
  allocator<unsigned_int> local_1421;
  dim_t i_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> main_nodes;
  allocator<char> local_13e1;
  string local_13e0;
  allocator<char> local_13b9;
  string local_13b8;
  stringstream local_1398 [8];
  stringstream ss_6;
  ostream local_1388 [376];
  Type local_1210;
  undefined1 local_11d8 [15];
  RefEl local_11c9;
  undefined1 local_11c8 [15];
  RefEl local_11b9;
  undefined1 local_11b8 [15];
  RefEl local_11a9;
  undefined1 local_11a8 [15];
  RefEl local_1199;
  undefined1 local_1198 [15];
  RefEl local_1189;
  undefined1 local_1188 [15];
  RefEl local_1179;
  undefined1 local_1178 [15];
  RefEl local_1169;
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_1168;
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> geom;
  ColXpr local_1128;
  Type local_10f0;
  undefined1 local_10b8 [8];
  Matrix<double,_3,_1,_0,_3,_1> node_coord;
  value_type *gi2i_e;
  Index i_1;
  MatrixXd node_coords;
  long num_nodes;
  value_type mesh_index;
  value_type *end_element;
  value_type *begin_element;
  size_t end;
  dim_t codim;
  RefEl ref_el_1;
  size_t begin;
  value_type *element_block;
  size_t ebi;
  Type local_1020;
  Matrix<double,__1,_1,_0,__1,_1> local_fe8;
  allocator<char> local_fd1;
  string local_fd0;
  allocator<char> local_fa9;
  string local_fa8;
  allocator<char> local_f81;
  string local_f80;
  string local_f60;
  allocator<char> local_f39;
  string local_f38;
  allocator<char> local_f11;
  string local_f10;
  stringstream local_ef0 [8];
  stringstream ss_5;
  ostream local_ee0 [380];
  value_type local_d64;
  undefined1 auStack_d60 [4];
  size_type mi;
  _Bit_type local_d58;
  pair<unsigned_long,_unsigned_long> local_d50;
  allocator<char> local_d39;
  string local_d38;
  allocator<char> local_d11;
  string local_d10;
  allocator<char> local_ce9;
  string local_ce8;
  string local_cc8;
  allocator<char> local_ca1;
  string local_ca0;
  allocator<char> local_c79;
  string local_c78;
  stringstream local_c58 [8];
  stringstream ss_4;
  ostream local_c48 [376];
  const_reference local_ad0;
  value_type *n;
  size_t k;
  value_type *node_block;
  size_t j;
  pair<unsigned_int,_unsigned_int> local_aa8;
  undefined1 local_aa0 [8];
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  gi2i;
  undefined1 local_a80 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> gi2mi;
  string local_a60;
  allocator<char> local_a39;
  string local_a38;
  allocator<char> local_a11;
  string local_a10;
  string local_9f0;
  allocator<char> local_9c9;
  string local_9c8;
  allocator<char> local_9a1;
  string local_9a0;
  stringstream local_980 [8];
  stringstream ss_3;
  ostream local_970 [380];
  uint local_7f4;
  undefined1 auStack_7f0 [4];
  dim_t c;
  _Bit_type local_7e8;
  value_type local_7e0;
  value_type node_tag;
  type *ptStack_7d0;
  uint i;
  type *node_indices;
  pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *element;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *__range4;
  undefined1 local_7a0 [6];
  RefEl ref_el;
  allocator<char> local_779;
  string local_778;
  allocator<char> local_751;
  string local_750;
  string local_730;
  allocator<char> local_709;
  string local_708;
  allocator<char> local_6e1;
  string local_6e0;
  stringstream local_6c0 [8];
  stringstream ss_2;
  ostream local_6b0 [383];
  allocator<char> local_531;
  string local_530;
  allocator<char> local_509;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  allocator<char> local_471;
  string local_470;
  stringstream local_450 [8];
  stringstream ss_1;
  ostream local_440 [376];
  reference local_2c8;
  ElementBlock *eb;
  const_iterator __end2;
  const_iterator __begin2;
  vector<lf::io::GMshFileV4::ElementBlock,_std::allocator<lf::io::GMshFileV4::ElementBlock>_>
  *__range2;
  undefined1 local_2a0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> num_entities;
  undefined1 local_280 [8];
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  mi2gi;
  undefined1 local_260 [8];
  vector<bool,_std::allocator<bool>_> is_main_node;
  size_t max_node_tag;
  size_t min_node_tag;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  uint local_20;
  uint local_1c;
  dim_t dim_world;
  dim_t dim_mesh;
  GMshFileV4 *msh_file_local;
  GmshReader *this_local;
  
  _dim_world = msh_file;
  msh_file_local = (GMshFileV4 *)this;
  pMVar16 = std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
            operator->(&this->mesh_factory_);
  local_1c = (*pMVar16->_vptr_MeshFactory[1])();
  pMVar16 = std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
            operator->(&this->mesh_factory_);
  local_20 = (**pMVar16->_vptr_MeshFactory)();
  if ((((local_1c < 2) || (3 < local_1c)) || (local_20 < 2)) || (3 < local_20)) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::operator<<(local_198,"GmshReader supports only 2D and 3D meshes.");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,
               "dim_mesh >= 2 && dim_mesh <= 3 && dim_world >= 2 && dim_world <= 3",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
               ,&local_201);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d8,&local_200,0x165,(string *)&min_node_tag);
    std::__cxx11::string::~string((string *)&min_node_tag);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar17,"this code should not be reached");
    __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar2 = (_dim_world->nodes).min_node_tag;
  is_main_node.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)(_dim_world->nodes).max_node_tag;
  sVar18 = (long)is_main_node.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_end_of_storage + (1 - sVar2);
  mi2gi.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  this_00 = (allocator<bool> *)
            ((long)&mi2gi.
                    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
  std::allocator<bool>::allocator(this_00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_260,sVar18,
             (bool *)((long)&mi2gi.
                             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),this_00);
  std::allocator<bool>::~allocator
            ((allocator<bool> *)
             ((long)&mi2gi.
                     super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  uVar10 = local_1c + 1;
  this_01 = (allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             *)((long)&num_entities.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::
  allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::allocator(this_01);
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            *)local_280,(ulong)uVar10,this_01);
  std::
  allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::~allocator((allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                *)((long)&num_entities.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 7));
  pMVar16 = std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
            operator->(&this->mesh_factory_);
  iVar11 = (*pMVar16->_vptr_MeshFactory[1])();
  __range2._4_4_ = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&__range2 + 3));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2a0,(ulong)(iVar11 + 1),
             (value_type_conflict *)((long)&__range2 + 4),
             (allocator<unsigned_int> *)((long)&__range2 + 3));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&__range2 + 3));
  this_02 = &(_dim_world->elements).element_blocks;
  __end2 = std::
           vector<lf::io::GMshFileV4::ElementBlock,_std::allocator<lf::io::GMshFileV4::ElementBlock>_>
           ::begin(this_02);
  eb = (ElementBlock *)
       std::
       vector<lf::io::GMshFileV4::ElementBlock,_std::allocator<lf::io::GMshFileV4::ElementBlock>_>::
       end(this_02);
  while( true ) {
    bVar7 = __gnu_cxx::
            operator==<const_lf::io::GMshFileV4::ElementBlock_*,_std::vector<lf::io::GMshFileV4::ElementBlock,_std::allocator<lf::io::GMshFileV4::ElementBlock>_>_>
                      (&__end2,(__normal_iterator<const_lf::io::GMshFileV4::ElementBlock_*,_std::vector<lf::io::GMshFileV4::ElementBlock,_std::allocator<lf::io::GMshFileV4::ElementBlock>_>_>
                                *)&eb);
    if (((bVar7 ^ 0xffU) & 1) == 0) break;
    local_2c8 = __gnu_cxx::
                __normal_iterator<const_lf::io::GMshFileV4::ElementBlock_*,_std::vector<lf::io::GMshFileV4::ElementBlock,_std::allocator<lf::io::GMshFileV4::ElementBlock>_>_>
                ::operator*(&__end2);
    if (local_1c < (uint)local_2c8->dimension) {
      std::__cxx11::stringstream::stringstream(local_450);
      poVar21 = std::operator<<(local_440,"mesh_factory->DimMesh() = ");
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,local_1c);
      poVar21 = std::operator<<(poVar21,", but msh-file contains entities with dimension ");
      iVar11 = DimOf(local_2c8->element_type);
      std::ostream::operator<<(poVar21,iVar11);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"eb.dimension <= dim_mesh",&local_471);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_498,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                 ,&local_499);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_470,&local_498,0x181,&local_4c0);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::~string((string *)&local_498);
      std::allocator<char>::~allocator(&local_499);
      std::__cxx11::string::~string((string *)&local_470);
      std::allocator<char>::~allocator(&local_471);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"false",&local_4e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_508,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                 ,&local_509);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_530,"",&local_531);
      lf::base::AssertionFailed(&local_4e0,&local_508,0x181,&local_530);
      std::__cxx11::string::~string((string *)&local_530);
      std::allocator<char>::~allocator(&local_531);
      std::__cxx11::string::~string((string *)&local_508);
      std::allocator<char>::~allocator(&local_509);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::allocator<char>::~allocator(&local_4e1);
      abort();
    }
    iVar11 = local_2c8->dimension;
    iVar12 = DimOf(local_2c8->element_type);
    if (iVar11 != iVar12) {
      std::__cxx11::stringstream::stringstream(local_6c0);
      poVar21 = std::operator<<(local_6b0,"error in GmshFile: Mismatch between entity block type (")
      ;
      poVar21 = io::operator<<(poVar21,local_2c8->element_type);
      poVar21 = std::operator<<(poVar21,") and dimension (");
      iVar11 = DimOf(local_2c8->element_type);
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,iVar11);
      std::operator<<(poVar21,")");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6e0,"eb.dimension == DimOf(eb.element_type)",&local_6e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_708,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                 ,&local_709);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_6e0,&local_708,0x185,&local_730);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_708);
      std::allocator<char>::~allocator(&local_709);
      std::__cxx11::string::~string((string *)&local_6e0);
      std::allocator<char>::~allocator(&local_6e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,"false",&local_751);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_778,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                 ,&local_779);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_7a0,"",(allocator<char> *)((long)&__range4 + 7));
      lf::base::AssertionFailed(&local_750,&local_778,0x185,(string *)local_7a0);
      std::__cxx11::string::~string((string *)local_7a0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
      std::__cxx11::string::~string((string *)&local_778);
      std::allocator<char>::~allocator(&local_779);
      std::__cxx11::string::~string((string *)&local_750);
      std::allocator<char>::~allocator(&local_751);
      abort();
    }
    sVar18 = std::
             vector<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::size(&local_2c8->elements);
    pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2a0,
                         (long)local_2c8->dimension);
    *pvVar20 = *pvVar20 + (int)sVar18;
    if (local_2c8->dimension == local_1c) {
      __range4._6_1_ = RefElOf(local_2c8->element_type);
      this_03 = &local_2c8->elements;
      __end4 = std::
               vector<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::begin(this_03);
      element = (pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                std::
                vector<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::end(this_03);
      while( true ) {
        bVar7 = __gnu_cxx::
                operator==<const_std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                          (&__end4,(__normal_iterator<const_std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                    *)&element);
        if (((bVar7 ^ 0xffU) & 1) == 0) break;
        node_indices = (type *)__gnu_cxx::
                               __normal_iterator<const_std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                               ::operator*(&__end4);
        ptStack_7d0 = std::
                      get<1ul,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                                ((pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)node_indices);
        node_tag._4_4_ = 0;
        while( true ) {
          uVar10 = node_tag._4_4_;
          sVar13 = lf::base::RefEl::NumNodes((RefEl *)((long)&__range4 + 6));
          if (sVar13 <= uVar10) break;
          pvVar28 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (ptStack_7d0,(ulong)node_tag._4_4_);
          local_7e0 = *pvVar28;
          sVar18 = std::vector<bool,_std::allocator<bool>_>::size
                             ((vector<bool,_std::allocator<bool>_> *)local_260);
          if (sVar18 <= local_7e0 - sVar2) {
            std::vector<bool,_std::allocator<bool>_>::resize
                      ((vector<bool,_std::allocator<bool>_> *)local_260,(local_7e0 - sVar2) + 1,
                       false);
          }
          rVar37 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_260,local_7e0 - sVar2);
          _auStack_7f0 = rVar37;
          std::_Bit_reference::operator=((_Bit_reference *)auStack_7f0,true);
          node_tag._4_4_ = node_tag._4_4_ + 1;
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::operator++(&__end4);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_lf::io::GMshFileV4::ElementBlock_*,_std::vector<lf::io::GMshFileV4::ElementBlock,_std::allocator<lf::io::GMshFileV4::ElementBlock>_>_>
    ::operator++(&__end2);
  }
  for (local_7f4 = 0; local_7f4 <= local_1c; local_7f4 = local_7f4 + 1) {
    pvVar19 = std::
              vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
              ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                            *)local_280,(ulong)local_7f4);
    pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2a0,
                         (ulong)(local_1c - local_7f4));
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::reserve(pvVar19,(ulong)*pvVar20);
  }
  pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2a0,
                       (ulong)local_1c);
  if (*pvVar20 == 0) {
    std::__cxx11::stringstream::stringstream(local_980);
    poVar21 = std::operator<<(local_970,"MshFile contains no elements with dimension ");
    std::ostream::operator<<(poVar21,local_1c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9a0,"num_entities[dim_mesh] > 0",&local_9a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9c8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
               ,&local_9c9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_9a0,&local_9c8,0x19e,&local_9f0);
    std::__cxx11::string::~string((string *)&local_9f0);
    std::__cxx11::string::~string((string *)&local_9c8);
    std::allocator<char>::~allocator(&local_9c9);
    std::__cxx11::string::~string((string *)&local_9a0);
    std::allocator<char>::~allocator(&local_9a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a10,"false",&local_a11);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
               ,&local_a39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a60,"",
               (allocator<char> *)
               ((long)&gi2mi.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    lf::base::AssertionFailed(&local_a10,&local_a38,0x19e,&local_a60);
    std::__cxx11::string::~string((string *)&local_a60);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&gi2mi.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_a38);
    std::allocator<char>::~allocator(&local_a39);
    std::__cxx11::string::~string((string *)&local_a10);
    std::allocator<char>::~allocator(&local_a11);
    abort();
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2a0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a80);
  sVar18 = std::vector<bool,_std::allocator<bool>_>::size
                     ((vector<bool,_std::allocator<bool>_> *)local_260);
  gi2i.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a80,sVar18,
             (value_type_conflict *)
             ((long)&gi2i.
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)local_aa0);
  sVar18 = std::vector<bool,_std::allocator<bool>_>::size
                     ((vector<bool,_std::allocator<bool>_> *)local_260);
  j._4_4_ = 0xffffffff;
  j._0_4_ = 0xffffffff;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_aa8,(int *)((long)&j + 4),(int *)&j);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::resize((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)local_aa0,sVar18,&local_aa8);
  node_block = (value_type *)0x0;
  while( true ) {
    pvVar6 = node_block;
    pvVar22 = (value_type *)
              std::
              vector<lf::io::GMshFileV4::NodeBlock,_std::allocator<lf::io::GMshFileV4::NodeBlock>_>
              ::size(&(_dim_world->nodes).node_blocks);
    if (pvVar22 <= pvVar6) break;
    k = (size_t)std::
                vector<lf::io::GMshFileV4::NodeBlock,_std::allocator<lf::io::GMshFileV4::NodeBlock>_>
                ::operator[](&(_dim_world->nodes).node_blocks,(size_type)node_block);
    n = (value_type *)0x0;
    while( true ) {
      pvVar5 = n;
      pvVar23 = (value_type *)
                std::
                vector<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                ::size((vector<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                        *)(k + 0x10));
      if (pvVar23 <= pvVar5) break;
      local_ad0 = std::
                  vector<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  ::operator[]((vector<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                                *)(k + 0x10),(size_type)n);
      sVar18 = std::
               vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ::size((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)local_aa0);
      if (sVar18 <= local_ad0->first - sVar2) {
        std::__cxx11::stringstream::stringstream(local_c58);
        std::operator<<(local_c48,"error: node_tag is higher than max_node_tag");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c78,"gi2i.size() > n.first - min_node_tag",&local_c79);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ca0,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                   ,&local_ca1);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_c78,&local_ca0,0x1b4,&local_cc8);
        std::__cxx11::string::~string((string *)&local_cc8);
        std::__cxx11::string::~string((string *)&local_ca0);
        std::allocator<char>::~allocator(&local_ca1);
        std::__cxx11::string::~string((string *)&local_c78);
        std::allocator<char>::~allocator(&local_c79);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_ce8,"false",&local_ce9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d10,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                   ,&local_d11);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d38,"",&local_d39);
        lf::base::AssertionFailed(&local_ce8,&local_d10,0x1b4,&local_d38);
        std::__cxx11::string::~string((string *)&local_d38);
        std::allocator<char>::~allocator(&local_d39);
        std::__cxx11::string::~string((string *)&local_d10);
        std::allocator<char>::~allocator(&local_d11);
        std::__cxx11::string::~string((string *)&local_ce8);
        std::allocator<char>::~allocator(&local_ce9);
        abort();
      }
      pVar36 = std::make_pair<unsigned_long&,unsigned_long&>
                         ((unsigned_long *)&node_block,(unsigned_long *)&n);
      local_d50 = pVar36;
      this_04 = std::
                vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              *)local_aa0,local_ad0->first - sVar2);
      std::pair<unsigned_int,unsigned_int>::operator=
                ((pair<unsigned_int,unsigned_int> *)this_04,&local_d50);
      rVar37 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_260,local_ad0->first - sVar2)
      ;
      _auStack_d60 = rVar37;
      bVar7 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)auStack_d60);
      if (((bVar7 ^ 0xffU) & 1) == 0) {
        if (local_20 == 2) {
          pdVar24 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)
                               &local_ad0->second,2);
          if ((*pdVar24 != 0.0) || (NAN(*pdVar24))) {
            std::__cxx11::stringstream::stringstream(local_ef0);
            std::operator<<(local_ee0,
                            "In a 2D GmshMesh, the z-coordinate of every node must be zero");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f10,"n.second(2) == 0",&local_f11);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f38,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                       ,&local_f39);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_f10,&local_f38,0x1c0,&local_f60);
            std::__cxx11::string::~string((string *)&local_f60);
            std::__cxx11::string::~string((string *)&local_f38);
            std::allocator<char>::~allocator(&local_f39);
            std::__cxx11::string::~string((string *)&local_f10);
            std::allocator<char>::~allocator(&local_f11);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f80,"false",&local_f81);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_fa8,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                       ,&local_fa9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_fd0,"",&local_fd1);
            lf::base::AssertionFailed(&local_f80,&local_fa8,0x1c0,&local_fd0);
            std::__cxx11::string::~string((string *)&local_fd0);
            std::allocator<char>::~allocator(&local_fd1);
            std::__cxx11::string::~string((string *)&local_fa8);
            std::allocator<char>::~allocator(&local_fa9);
            std::__cxx11::string::~string((string *)&local_f80);
            std::allocator<char>::~allocator(&local_f81);
            abort();
          }
          pMVar16 = std::
                    unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
                    operator->(&this->mesh_factory_);
          Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::topRows<int>
                    (&local_1020,
                     (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_ad0->second,2);
          Eigen::Matrix<double,-1,1,0,-1,1>::
          Matrix<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,_1,1,false>>
                    ((Matrix<double,_1,1,0,_1,1> *)&local_fe8,
                     (EigenBase<Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_>
                      *)&local_1020);
          local_d64 = (*pMVar16->_vptr_MeshFactory[2])(pMVar16,&local_fe8);
          Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_fe8);
        }
        else {
          pMVar16 = std::
                    unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
                    operator->(&this->mesh_factory_);
          Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,3,1,0,3,1>>
                    ((Matrix<double,_1,1,0,_1,1> *)&ebi,
                     (EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_ad0->second);
          local_d64 = (*pMVar16->_vptr_MeshFactory[2])(pMVar16,&ebi);
          Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&ebi);
        }
        vVar1 = local_d64;
        pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a80,
                             local_ad0->first - sVar2);
        *pvVar20 = vVar1;
      }
      n = (value_type *)((long)&n->first + 1);
    }
    node_block = (value_type *)((long)&node_block->entity_dim + 1);
  }
  element_block = (value_type *)0x0;
  while( true ) {
    pvVar4 = element_block;
    pvVar25 = (value_type *)
              std::
              vector<lf::io::GMshFileV4::ElementBlock,_std::allocator<lf::io::GMshFileV4::ElementBlock>_>
              ::size(&(_dim_world->elements).element_blocks);
    if (pvVar25 <= pvVar4) break;
    pvVar26 = std::
              vector<lf::io::GMshFileV4::ElementBlock,_std::allocator<lf::io::GMshFileV4::ElementBlock>_>
              ::operator[](&(_dim_world->elements).element_blocks,(size_type)element_block);
    _codim = (value_type *)0x0;
    end._7_1_ = RefElOf(pvVar26->element_type);
    uVar10 = local_1c;
    dVar14 = lf::base::RefEl::Dimension((RefEl *)((long)&end + 7));
    end._0_4_ = uVar10 - dVar14;
    begin_element = (value_type *)0x0;
    while( true ) {
      pvVar3 = begin_element;
      pvVar27 = (value_type *)
                std::
                vector<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::size(&pvVar26->elements);
      if (pvVar27 <= pvVar3) break;
      end_element = std::
                    vector<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    ::operator[](&pvVar26->elements,(size_type)_codim);
      _mesh_index = std::
                    vector<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    ::operator[](&pvVar26->elements,(size_type)begin_element);
      bVar7 = std::operator==(&end_element->second,&_mesh_index->second);
      if ((bVar7) && (_codim != begin_element)) {
        pvVar19 = std::
                  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                *)local_280,(ulong)(uint)end);
        pvVar29 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                  std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::back(pvVar19);
        std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                  (pvVar29,(unsigned_long *)&element_block);
      }
      else {
        _codim = begin_element;
        RVar8 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)&end + 7));
        num_nodes._7_1_ = lf::base::RefEl::kPoint();
        RVar9 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)&num_nodes + 7));
        if (RVar8 == RVar9) {
          pvVar28 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&_mesh_index->second,0);
          pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a80,
                               *pvVar28 - sVar2);
          uVar10 = *pvVar20;
          num_nodes._0_4_ = uVar10;
          uVar15 = std::numeric_limits<unsigned_int>::max();
          if (uVar10 != uVar15) {
            pvVar19 = std::
                      vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                    *)local_280,(ulong)local_1c);
            sVar18 = std::
                     vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ::size(pvVar19);
            if (sVar18 <= (uint)num_nodes) {
              pvVar19 = std::
                        vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                      *)local_280,(ulong)local_1c);
              std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::resize(pvVar19,(ulong)((uint)num_nodes + 1));
            }
            pvVar19 = std::
                      vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                    *)local_280,(ulong)local_1c);
            pvVar29 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                      std::
                      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ::operator[](pvVar19,(ulong)(uint)num_nodes);
            std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                      (pvVar29,(unsigned_long *)&element_block);
          }
        }
        else {
          sVar18 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                             (&_mesh_index->second);
          node_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols = lf::base::narrow<long,unsigned_long>(sVar18);
          Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_int,long>
                    ((Matrix<double,_1,_1,0,_1,_1> *)&i_1,&local_20,
                     &node_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols);
          for (gi2i_e = (value_type *)0x0;
              (long)gi2i_e <
              node_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
              .m_cols; gi2i_e = (value_type *)((long)&gi2i_e->first + 1)) {
            pvVar28 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&_mesh_index->second,(size_type)gi2i_e);
            node_coord.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
            .array[2] = (double)std::
                                vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                              *)local_aa0,*pvVar28 - sVar2);
            pvVar30 = std::
                      vector<lf::io::GMshFileV4::NodeBlock,_std::allocator<lf::io::GMshFileV4::NodeBlock>_>
                      ::operator[](&(_dim_world->nodes).node_blocks,
                                   (ulong)((reference)
                                          node_coord.
                                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                          .m_storage.m_data.array[2])->first);
            pvVar31 = std::
                      vector<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                      ::operator[](&pvVar30->nodes,
                                   (ulong)*(uint *)((long)node_coord.
                                                                                                                    
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                                  .m_storage.m_data.array[2] + 4));
            Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                      ((Matrix<double,_3,_1,_0,_3,_1> *)local_10b8,&pvVar31->second);
            if (local_20 == 2) {
              Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::topRows<int>
                        (&local_10f0,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_10b8,
                         2);
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                        (&local_1128,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&i_1,
                         (Index)gi2i_e);
              Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
                        ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&local_1128,
                         (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_>
                          *)&local_10f0);
            }
            else {
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                        ((ColXpr *)&geom,
                         (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&i_1,(Index)gi2i_e)
              ;
              Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
                        ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&geom,
                         (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_10b8);
            }
          }
          std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
          unique_ptr<std::default_delete<lf::geometry::Geometry>,void>
                    ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                      *)&local_1168);
          switch(pvVar26->element_type) {
          case EDGE2:
            local_1169 = lf::base::RefEl::kSegment();
            lf::base::RefEl::operator=((RefEl *)((long)&end + 7),&local_1169);
            std::make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_1178);
            std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
            operator=((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                       *)&local_1168,
                      (unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                       *)local_1178);
            std::unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
            ::~unique_ptr((unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                           *)local_1178);
            break;
          case TRIA3:
            local_1189 = lf::base::RefEl::kTria();
            lf::base::RefEl::operator=((RefEl *)((long)&end + 7),&local_1189);
            std::make_unique<lf::geometry::TriaO1,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_1198);
            std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
            operator=((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                       *)&local_1168,
                      (unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>
                       *)local_1198);
            std::unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>::
            ~unique_ptr((unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>
                         *)local_1198);
            break;
          case QUAD4:
            local_11a9 = lf::base::RefEl::kQuad();
            lf::base::RefEl::operator=((RefEl *)((long)&end + 7),&local_11a9);
            std::make_unique<lf::geometry::QuadO1,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_11b8);
            std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
            operator=((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                       *)&local_1168,
                      (unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_>
                       *)local_11b8);
            std::unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_>::
            ~unique_ptr((unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_>
                         *)local_11b8);
            break;
          default:
            std::__cxx11::stringstream::stringstream(local_1398);
            poVar21 = std::operator<<(local_1388,"Gmsh element type ");
            poVar21 = io::operator<<(poVar21,pvVar26->element_type);
            std::operator<<(poVar21," not (yet) supported by GmshReader.");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_13b8,"false",&local_13b9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_13e0,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                       ,&local_13e1);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed
                      (&local_13b8,&local_13e0,0x21c,
                       (string *)
                       &main_nodes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::~string
                      ((string *)
                       &main_nodes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::~string((string *)&local_13e0);
            std::allocator<char>::~allocator(&local_13e1);
            std::__cxx11::string::~string((string *)&local_13b8);
            std::allocator<char>::~allocator(&local_13b9);
            prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar17,"this code should not be reached");
            __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          case EDGE3:
            local_1179 = lf::base::RefEl::kSegment();
            lf::base::RefEl::operator=((RefEl *)((long)&end + 7),&local_1179);
            std::make_unique<lf::geometry::SegmentO2,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_1188);
            std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
            operator=((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                       *)&local_1168,
                      (unique_ptr<lf::geometry::SegmentO2,_std::default_delete<lf::geometry::SegmentO2>_>
                       *)local_1188);
            std::unique_ptr<lf::geometry::SegmentO2,_std::default_delete<lf::geometry::SegmentO2>_>
            ::~unique_ptr((unique_ptr<lf::geometry::SegmentO2,_std::default_delete<lf::geometry::SegmentO2>_>
                           *)local_1188);
            break;
          case TRIA6:
            local_1199 = lf::base::RefEl::kTria();
            lf::base::RefEl::operator=((RefEl *)((long)&end + 7),&local_1199);
            std::make_unique<lf::geometry::TriaO2,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_11a8);
            std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
            operator=((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                       *)&local_1168,
                      (unique_ptr<lf::geometry::TriaO2,_std::default_delete<lf::geometry::TriaO2>_>
                       *)local_11a8);
            std::unique_ptr<lf::geometry::TriaO2,_std::default_delete<lf::geometry::TriaO2>_>::
            ~unique_ptr((unique_ptr<lf::geometry::TriaO2,_std::default_delete<lf::geometry::TriaO2>_>
                         *)local_11a8);
            break;
          case QUAD9:
            local_11c9 = lf::base::RefEl::kQuad();
            lf::base::RefEl::operator=((RefEl *)((long)&end + 7),&local_11c9);
            Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::leftCols<int>
                      (&local_1210,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&i_1,8);
            std::
            make_unique<lf::geometry::QuadO2,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>>
                      ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true> *)local_11d8);
            std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
            operator=((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                       *)&local_1168,
                      (unique_ptr<lf::geometry::QuadO2,_std::default_delete<lf::geometry::QuadO2>_>
                       *)local_11d8);
            std::unique_ptr<lf::geometry::QuadO2,_std::default_delete<lf::geometry::QuadO2>_>::
            ~unique_ptr((unique_ptr<lf::geometry::QuadO2,_std::default_delete<lf::geometry::QuadO2>_>
                         *)local_11d8);
            break;
          case QUAD8:
            local_11b9 = lf::base::RefEl::kQuad();
            lf::base::RefEl::operator=((RefEl *)((long)&end + 7),&local_11b9);
            std::make_unique<lf::geometry::QuadO2,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_11c8);
            std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
            operator=((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                       *)&local_1168,
                      (unique_ptr<lf::geometry::QuadO2,_std::default_delete<lf::geometry::QuadO2>_>
                       *)local_11c8);
            std::unique_ptr<lf::geometry::QuadO2,_std::default_delete<lf::geometry::QuadO2>_>::
            ~unique_ptr((unique_ptr<lf::geometry::QuadO2,_std::default_delete<lf::geometry::QuadO2>_>
                         *)local_11c8);
          }
          sVar13 = lf::base::RefEl::NumNodes((RefEl *)((long)&end + 7));
          std::allocator<unsigned_int>::allocator(&local_1421);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_2,(ulong)sVar13,
                     &local_1421);
          std::allocator<unsigned_int>::~allocator(&local_1421);
          local_1428 = 0;
          while( true ) {
            uVar10 = local_1428;
            sVar13 = lf::base::RefEl::NumNodes((RefEl *)((long)&end + 7));
            if (sVar13 <= uVar10) break;
            pvVar28 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&_mesh_index->second,(ulong)local_1428);
            pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a80,
                                 *pvVar28 - sVar2);
            vVar1 = *pvVar20;
            pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_2,
                                 (ulong)local_1428);
            *pvVar20 = vVar1;
            local_1428 = local_1428 + 1;
          }
          pMVar16 = std::
                    unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
                    operator->(&this->mesh_factory_);
          local_1429 = end._7_1_;
          std::span<const_unsigned_int,_18446744073709551615UL>::
          span<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
                    (&local_1440,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_2);
          (*pMVar16->_vptr_MeshFactory[4])(pMVar16,(ulong)local_1429,&local_1440,&local_1168);
          pvVar19 = std::
                    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  *)local_280,(ulong)(uint)end);
          local_1470 = element_block;
          local_1468 = &local_1470;
          local_1460 = 1;
          std::allocator<unsigned_long>::allocator(&local_1471);
          __l._M_len = local_1460;
          __l._M_array = (iterator)local_1468;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_1458,__l,&local_1471);
          std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::push_back(pvVar19,&local_1458);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_1458);
          std::allocator<unsigned_long>::~allocator(&local_1471);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_2);
          std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
          ~unique_ptr(&local_1168);
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                    ((Matrix<double,__1,__1,_0,__1,__1> *)&i_1);
        }
      }
      begin_element = (value_type *)((long)&begin_element->first + 1);
    }
    element_block = (value_type *)((long)&element_block->dimension + 1);
  }
  pMVar16 = std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
            operator->(&this->mesh_factory_);
  (*pMVar16->_vptr_MeshFactory[5])
            (&gmei2gmphi._M_elems[3].
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::shared_ptr<lf::mesh::Mesh>::operator=
            (&this->mesh_,
             (shared_ptr<lf::mesh::Mesh> *)
             &gmei2gmphi._M_elems[3].
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::shared_ptr<lf::mesh::Mesh>::~shared_ptr
            ((shared_ptr<lf::mesh::Mesh> *)
             &gmei2gmphi._M_elems[3].
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
  ::array((array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
           *)local_14e8);
  local_14e9 = 0;
  if ((_dim_world->partitioned_entities).num_partitions == 0) {
    pvVar32 = std::
              array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
              ::operator[]((array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
                            *)local_14e8,(ulong)local_1c);
    entities = std::
               get<0ul,std::vector<lf::io::GMshFileV4::PointEntity,std::allocator<lf::io::GMshFileV4::PointEntity>>,std::vector<lf::io::GMshFileV4::Entity,std::allocator<lf::io::GMshFileV4::Entity>>,std::vector<lf::io::GMshFileV4::Entity,std::allocator<lf::io::GMshFileV4::Entity>>,std::vector<lf::io::GMshFileV4::Entity,std::allocator<lf::io::GMshFileV4::Entity>>>
                         (&_dim_world->entities);
    InitGmshFile(lf::io::GMshFileV4_const&)::$_0::operator()(&local_14e9,pvVar32,entities);
    pvVar32 = std::
              array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
              ::operator[]((array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
                            *)local_14e8,(ulong)(local_1c - 1));
    entities_00 = std::
                  get<1ul,std::vector<lf::io::GMshFileV4::PointEntity,std::allocator<lf::io::GMshFileV4::PointEntity>>,std::vector<lf::io::GMshFileV4::Entity,std::allocator<lf::io::GMshFileV4::Entity>>,std::vector<lf::io::GMshFileV4::Entity,std::allocator<lf::io::GMshFileV4::Entity>>,std::vector<lf::io::GMshFileV4::Entity,std::allocator<lf::io::GMshFileV4::Entity>>>
                            (&_dim_world->entities);
    InitGmshFile(lf::io::GMshFileV4_const&)::$_0::operator()(&local_14e9,pvVar32,entities_00);
    pvVar32 = std::
              array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
              ::operator[]((array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
                            *)local_14e8,(ulong)(local_1c - 2));
    entities_01 = std::
                  get<2ul,std::vector<lf::io::GMshFileV4::PointEntity,std::allocator<lf::io::GMshFileV4::PointEntity>>,std::vector<lf::io::GMshFileV4::Entity,std::allocator<lf::io::GMshFileV4::Entity>>,std::vector<lf::io::GMshFileV4::Entity,std::allocator<lf::io::GMshFileV4::Entity>>,std::vector<lf::io::GMshFileV4::Entity,std::allocator<lf::io::GMshFileV4::Entity>>>
                            (&_dim_world->entities);
    InitGmshFile(lf::io::GMshFileV4_const&)::$_0::operator()(&local_14e9,pvVar32,entities_01);
    if (local_1c == 3) {
      pvVar32 = std::
                array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
                ::operator[]((array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
                              *)local_14e8,0);
      entities_02 = std::
                    get<3ul,std::vector<lf::io::GMshFileV4::PointEntity,std::allocator<lf::io::GMshFileV4::PointEntity>>,std::vector<lf::io::GMshFileV4::Entity,std::allocator<lf::io::GMshFileV4::Entity>>,std::vector<lf::io::GMshFileV4::Entity,std::allocator<lf::io::GMshFileV4::Entity>>,std::vector<lf::io::GMshFileV4::Entity,std::allocator<lf::io::GMshFileV4::Entity>>>
                              (&_dim_world->entities);
      InitGmshFile(lf::io::GMshFileV4_const&)::$_0::operator()(&local_14e9,pvVar32,entities_02);
    }
  }
  else {
    pvVar32 = std::
              array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
              ::operator[]((array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
                            *)local_14e8,(ulong)local_1c);
    entities_03 = std::
                  get<0ul,std::vector<lf::io::GMshFileV4::PartitionedPointEntity,std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>>,std::vector<lf::io::GMshFileV4::PartitionedEntity,std::allocator<lf::io::GMshFileV4::PartitionedEntity>>,std::vector<lf::io::GMshFileV4::PartitionedEntity,std::allocator<lf::io::GMshFileV4::PartitionedEntity>>,std::vector<lf::io::GMshFileV4::PartitionedEntity,std::allocator<lf::io::GMshFileV4::PartitionedEntity>>>
                            (&(_dim_world->partitioned_entities).partitioned_entities);
    InitGmshFile(lf::io::GMshFileV4_const&)::$_0::operator()(&local_14e9,pvVar32,entities_03);
    pvVar32 = std::
              array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
              ::operator[]((array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
                            *)local_14e8,(ulong)(local_1c - 1));
    entities_04 = std::
                  get<1ul,std::vector<lf::io::GMshFileV4::PartitionedPointEntity,std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>>,std::vector<lf::io::GMshFileV4::PartitionedEntity,std::allocator<lf::io::GMshFileV4::PartitionedEntity>>,std::vector<lf::io::GMshFileV4::PartitionedEntity,std::allocator<lf::io::GMshFileV4::PartitionedEntity>>,std::vector<lf::io::GMshFileV4::PartitionedEntity,std::allocator<lf::io::GMshFileV4::PartitionedEntity>>>
                            (&(_dim_world->partitioned_entities).partitioned_entities);
    InitGmshFile(lf::io::GMshFileV4_const&)::$_0::operator()(&local_14e9,pvVar32,entities_04);
    pvVar32 = std::
              array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
              ::operator[]((array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
                            *)local_14e8,(ulong)(local_1c - 2));
    entities_05 = std::
                  get<2ul,std::vector<lf::io::GMshFileV4::PartitionedPointEntity,std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>>,std::vector<lf::io::GMshFileV4::PartitionedEntity,std::allocator<lf::io::GMshFileV4::PartitionedEntity>>,std::vector<lf::io::GMshFileV4::PartitionedEntity,std::allocator<lf::io::GMshFileV4::PartitionedEntity>>,std::vector<lf::io::GMshFileV4::PartitionedEntity,std::allocator<lf::io::GMshFileV4::PartitionedEntity>>>
                            (&(_dim_world->partitioned_entities).partitioned_entities);
    InitGmshFile(lf::io::GMshFileV4_const&)::$_0::operator()(&local_14e9,pvVar32,entities_05);
    if (local_1c == 3) {
      pvVar32 = std::
                array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
                ::operator[]((array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
                              *)local_14e8,0);
      entities_06 = std::
                    get<3ul,std::vector<lf::io::GMshFileV4::PartitionedPointEntity,std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>>,std::vector<lf::io::GMshFileV4::PartitionedEntity,std::allocator<lf::io::GMshFileV4::PartitionedEntity>>,std::vector<lf::io::GMshFileV4::PartitionedEntity,std::allocator<lf::io::GMshFileV4::PartitionedEntity>>,std::vector<lf::io::GMshFileV4::PartitionedEntity,std::allocator<lf::io::GMshFileV4::PartitionedEntity>>>
                              (&(_dim_world->partitioned_entities).partitioned_entities);
      InitGmshFile(lf::io::GMshFileV4_const&)::$_0::operator()(&local_14e9,pvVar32,entities_06);
    }
  }
  std::shared_ptr<lf::mesh::Mesh_const>::shared_ptr<lf::mesh::Mesh,void>
            ((shared_ptr<lf::mesh::Mesh_const> *)local_1510,&this->mesh_);
  lf::mesh::utils::make_AllCodimMeshDataSet<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((utils *)&local_1500,(shared_ptr<const_lf::mesh::Mesh> *)local_1510);
  std::
  shared_ptr<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator=(&this->physical_nrs_,&local_1500);
  std::
  shared_ptr<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~shared_ptr(&local_1500);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr((shared_ptr<const_lf::mesh::Mesh> *)local_1510)
  ;
  __range3._4_4_ = 0;
  do {
    if (local_1c < __range3._4_4_) {
      this_08 = &_dim_world->physical_names;
      __end2_1 = std::
                 vector<lf::io::GMshFileV4::PhysicalName,_std::allocator<lf::io::GMshFileV4::PhysicalName>_>
                 ::begin(this_08);
      pn = (PhysicalName *)
           std::
           vector<lf::io::GMshFileV4::PhysicalName,_std::allocator<lf::io::GMshFileV4::PhysicalName>_>
           ::end(this_08);
      while( true ) {
        bVar7 = __gnu_cxx::
                operator==<const_lf::io::GMshFileV4::PhysicalName_*,_std::vector<lf::io::GMshFileV4::PhysicalName,_std::allocator<lf::io::GMshFileV4::PhysicalName>_>_>
                          (&__end2_1,
                           (__normal_iterator<const_lf::io::GMshFileV4::PhysicalName_*,_std::vector<lf::io::GMshFileV4::PhysicalName,_std::allocator<lf::io::GMshFileV4::PhysicalName>_>_>
                            *)&pn);
        if (((bVar7 ^ 0xffU) & 1) == 0) break;
        local_15e0 = __gnu_cxx::
                     __normal_iterator<const_lf::io::GMshFileV4::PhysicalName_*,_std::vector<lf::io::GMshFileV4::PhysicalName,_std::allocator<lf::io::GMshFileV4::PhysicalName>_>_>
                     ::operator*(&__end2_1);
        __x = &local_15e0->name;
        local_1614 = local_1c - local_15e0->dimension;
        std::pair<int,_unsigned_int>::pair<unsigned_int,_true>
                  (&local_1610,&local_15e0->physical_tag,&local_1614);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_unsigned_int>_>
        ::pair<std::pair<int,_unsigned_int>,_true>(&local_1608,__x,&local_1610);
        local_1620 = (_Base_ptr)
                     std::
                     multimap<std::__cxx11::string,std::pair<unsigned_int,unsigned_int>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>>
                     ::insert<std::pair<std::__cxx11::string,std::pair<int,unsigned_int>>>
                               ((multimap<std::__cxx11::string,std::pair<unsigned_int,unsigned_int>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>>
                                 *)&this->name_2_nr_,&local_1608);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_unsigned_int>_>
        ::~pair(&local_1608);
        __x_00 = &local_15e0->physical_tag;
        local_167c = local_1c - local_15e0->dimension;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
        ::pair<unsigned_int,_true>(&local_1678,&local_15e0->name,&local_167c);
        std::
        pair<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
        ::
        pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                  (&local_1650,__x_00,&local_1678);
        std::
        multimap<unsigned_int,std::pair<std::__cxx11::string,unsigned_int>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,unsigned_int>>>>
        ::insert<std::pair<int,std::pair<std::__cxx11::string,unsigned_int>>>
                  ((multimap<unsigned_int,std::pair<std::__cxx11::string,unsigned_int>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,unsigned_int>>>>
                    *)&this->nr_2_name_,&local_1650);
        std::
        pair<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
        ::~pair(&local_1650);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
        ::~pair(&local_1678);
        __gnu_cxx::
        __normal_iterator<const_lf::io::GMshFileV4::PhysicalName_*,_std::vector<lf::io::GMshFileV4::PhysicalName,_std::allocator<lf::io::GMshFileV4::PhysicalName>_>_>
        ::operator++(&__end2_1);
      }
      std::
      vector<lf::io::GMshFileV4::PeriodicLink,_std::allocator<lf::io::GMshFileV4::PeriodicLink>_>::
      empty(&_dim_world->periodic_links);
      std::
      array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
      ::~array((array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
                *)local_14e8);
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *)local_aa0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a80);
      std::
      vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ::~vector((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 *)local_280);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_260);
      return;
    }
    peVar33 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    iVar11 = (*peVar33->_vptr_Mesh[2])(peVar33,(ulong)__range3._4_4_);
    __begin3._M_current = (Entity **)CONCAT44(extraout_var,iVar11);
    __end3 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
    e = (Entity *)
        std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                  ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
    while( true ) {
      bVar7 = __gnu_cxx::
              operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                        (&__end3,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                  *)&e);
      if (((bVar7 ^ 0xffU) & 1) == 0) break;
      ppEVar34 = __gnu_cxx::
                 __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                 ::operator*(&__end3);
      e_00 = *ppEVar34;
      peVar33 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
      temp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (*peVar33->_vptr_Mesh[5])(peVar33,e_00);
      if (__range3._4_4_ == local_1c) {
        uVar35 = (ulong)temp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage._4_4_;
        pvVar19 = std::
                  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                *)local_280,(ulong)local_1c);
        sVar18 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::size(pvVar19);
        if (uVar35 < sVar18) goto LAB_0047d7b8;
      }
      else {
LAB_0047d7b8:
        pvVar19 = std::
                  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                *)local_280,(ulong)__range3._4_4_);
        sVar18 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::size(pvVar19);
        if (temp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ < sVar18) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range5);
          pvVar19 = std::
                    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ::operator[]((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  *)local_280,(ulong)__range3._4_4_);
          this_05 = std::
                    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ::operator[](pvVar19,(ulong)temp.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                                _4_4_);
          __end5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_05);
          gmsh_index = (unsigned_long *)
                       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_05);
          while( true ) {
            bVar7 = __gnu_cxx::
                    operator==<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              (&__end5,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                        *)&gmsh_index);
            if (((bVar7 ^ 0xffU) & 1) == 0) break;
            element_block_1 =
                 (value_type *)
                 __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&__end5);
            sVar18._0_4_ = element_block_1->dimension;
            sVar18._4_4_ = element_block_1->entity_tag;
            physical_tags =
                 (value_type *)
                 std::
                 vector<lf::io::GMshFileV4::ElementBlock,_std::allocator<lf::io::GMshFileV4::ElementBlock>_>
                 ::operator[](&(_dim_world->elements).element_blocks,sVar18);
            pvVar32 = std::
                      array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
                      ::operator[]((array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
                                    *)local_14e8,(ulong)__range3._4_4_);
            local_1598 = std::
                         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ::operator[](pvVar32,(long)*(int *)((long)&(physical_tags->
                                                                                                                                        
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_start + 4));
            local_15a8._M_current =
                 (uint *)std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range5
                                   );
            __gnu_cxx::
            __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ::__normal_iterator<unsigned_int*>
                      ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        *)&local_15a0,&local_15a8);
            __first = std::begin<std::vector<int,std::allocator<int>>>(local_1598);
            __last = std::end<std::vector<int,std::allocator<int>>>(local_1598);
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&__range5,local_15a0,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       __first._M_current,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       __last._M_current);
            __gnu_cxx::
            __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator++(&__end5);
          }
          this_06 = std::
                    __shared_ptr_access<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->physical_nrs_);
          this_07 = lf::mesh::utils::
                    AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                    operator()(this_06,e_00);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    (this_07,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range5);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range5);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
      ::operator++(&__end3);
    }
    __range3._4_4_ = __range3._4_4_ + 1;
  } while( true );
}

Assistant:

void GmshReader::InitGmshFile(const GMshFileV4& msh_file) {
  // 1) Check Gmsh_file and initialize
  //////////////////////////////////////////////////////////////////////////

  const dim_t dim_mesh = mesh_factory_->DimMesh();
  const dim_t dim_world = mesh_factory_->DimWorld();
  LF_VERIFY_MSG(
      dim_mesh >= 2 && dim_mesh <= 3 && dim_world >= 2 && dim_world <= 3,
      "GmshReader supports only 2D and 3D meshes.");

  // 1) Determine which nodes of gmsh are also nodes of the LehrFEM++ mesh +
  // count number of entities of each codimension (exclude auxilliary nodes).
  // This is necessary because e.g. second order meshes in gmsh need a lot of
  // auxilliary nodes to define their geometry...
  /////////////////////////////////////////////////////////////////////////////
  auto min_node_tag = msh_file.nodes.min_node_tag;
  auto max_node_tag = msh_file.nodes.max_node_tag;

  // is_main_node[i] = true means that gmsh-node (i + min_node_tag) is one of
  // the main nodes of an element
  std::vector<bool> is_main_node(max_node_tag - min_node_tag + 1, false);

  // mi2gi = mesh_index_2_gmsh_index
  // mi2gi[c][i] contains the index of the gmsh entity block that contains
  // the mesh entity with codim = c and mesh index i.
  std::vector<std::vector<std::vector<std::size_t>>> mi2gi(dim_mesh + 1);

  {
    // count the number of entities for each codimension and reserve space:
    std::vector<size_type> num_entities(mesh_factory_->DimMesh() + 1, 0);

    for (const auto& eb : msh_file.elements.element_blocks) {
      LF_ASSERT_MSG(eb.dimension <= dim_mesh,
                    "mesh_factory->DimMesh() = "
                        << dim_mesh
                        << ", but msh-file contains entities with dimension "
                        << DimOf(eb.element_type));
      LF_ASSERT_MSG(eb.dimension == DimOf(eb.element_type),
                    "error in GmshFile: Mismatch between entity block type ("
                        << eb.element_type << ") and dimension ("
                        << DimOf(eb.element_type) << ")");

      num_entities[eb.dimension] += eb.elements.size();

      if (eb.dimension == dim_mesh) {
        // mark main nodes
        auto ref_el = RefElOf(eb.element_type);
        for (const auto& element : eb.elements) {
          const auto& node_indices = std::get<1>(element);
          for (unsigned int i = 0; i < ref_el.NumNodes(); ++i) {
            auto node_tag = node_indices[i];
            if (is_main_node.size() <= node_tag - min_node_tag) {
              is_main_node.resize(node_tag - min_node_tag + 1);
            }
            is_main_node[node_tag - min_node_tag] = true;
          }
        }
      }
    }

    for (dim_t c = 0; c <= dim_mesh; ++c) {
      mi2gi[c].reserve(num_entities[dim_mesh - c]);
    }

    LF_ASSERT_MSG(num_entities[dim_mesh] > 0,
                  "MshFile contains no elements with dimension " << dim_mesh);
  }

  // 2) Insert main nodes into MeshFactory
  /////////////////////////////////////////////////////////////////////////////

  // gmsh_index_2_mesh_index for nodes:
  // gi2mi[i] = j means that gmsh node with gmsh tag i+min_node_tag has mesh
  // index j
  std::vector<size_type> gi2mi;
  gi2mi.resize(is_main_node.size(), -1);

  // gi2i[i] = (j,k) implies msh_file.nodes.node_blocks[j].nodes[k].first = i +
  // min_node_tag
  std::vector<std::pair<size_type, size_type>> gi2i;
  gi2i.resize(is_main_node.size(), {-1, -1});

  for (std::size_t j = 0; j < msh_file.nodes.node_blocks.size(); ++j) {
    const auto& node_block = msh_file.nodes.node_blocks[j];
    for (std::size_t k = 0; k < node_block.nodes.size(); ++k) {
      const auto& n = node_block.nodes[k];
      LF_ASSERT_MSG(gi2i.size() > n.first - min_node_tag,
                    "error: node_tag is higher than max_node_tag");

      gi2i[n.first - min_node_tag] = std::make_pair(j, k);

      if (!is_main_node[n.first - min_node_tag]) {
        continue;
      }

      size_type mi;
      if (dim_world == 2) {
        LF_ASSERT_MSG(
            n.second(2) == 0,
            "In a 2D GmshMesh, the z-coordinate of every node must be zero");
        mi = mesh_factory_->AddPoint(n.second.topRows(2));
      } else {
        mi = mesh_factory_->AddPoint(n.second);
      }
      gi2mi[n.first - min_node_tag] = mi;
    }
  }

  // 3) Insert entities (except nodes) into MeshFactory:
  //////////////////////////////////////////////////////////////////////////////

  for (std::size_t ebi = 0; ebi < msh_file.elements.element_blocks.size();
       ++ebi) {
    const auto& element_block = msh_file.elements.element_blocks[ebi];
    std::size_t begin = 0;
    auto ref_el = RefElOf(element_block.element_type);
    auto codim = dim_mesh - ref_el.Dimension();

    for (std::size_t end = 0; end < element_block.elements.size(); ++end) {
      const auto& begin_element = element_block.elements[begin];
      const auto& end_element = element_block.elements[end];

      if (begin_element.second == end_element.second && begin != end) {
        // This entity appears more than once
        mi2gi[codim].back().emplace_back(ebi);
        continue;
      }

      begin = end;
      if (ref_el == base::RefEl::kPoint()) {
        // check that this node is a main node (auxiliary nodes are not
        // inserted into the mesh!):

        auto mesh_index = gi2mi[end_element.second[0] - min_node_tag];
        if (mesh_index != std::numeric_limits<unsigned int>::max()) {
          // special case, this entity is a point (which has already been
          // inserted)
          if (mi2gi[dim_mesh].size() <= mesh_index) {
            mi2gi[dim_mesh].resize(mesh_index + 1);
          }
          mi2gi[dim_mesh][mesh_index].emplace_back(ebi);
        }
      } else {
        // gmsh element is not a point -> insert entity:
        auto num_nodes = base::narrow<Eigen::Index>(end_element.second.size());
        Eigen::MatrixXd node_coords(dim_world, num_nodes);
        for (Eigen::Index i = 0; i < num_nodes; ++i) {
          auto& gi2i_e = gi2i[end_element.second[i] - min_node_tag];
          auto node_coord = msh_file.nodes.node_blocks[gi2i_e.first]
                                .nodes[gi2i_e.second]
                                .second;
          if (dim_world == 2) {
            node_coords.col(i) = node_coord.topRows(2);
          } else {
            node_coords.col(i) = node_coord;
          }
        }
        std::unique_ptr<geometry::Geometry> geom;

        switch (element_block.element_type) {
          case GMshFileV4::ElementType::EDGE2:
            ref_el = base::RefEl::kSegment();
            geom = std::make_unique<geometry::SegmentO1>(node_coords);
            break;
          case GMshFileV4::ElementType::EDGE3:
            ref_el = base::RefEl::kSegment();
            geom = std::make_unique<geometry::SegmentO2>(node_coords);
            break;
          case GMshFileV4::ElementType::TRIA3:
            ref_el = base::RefEl::kTria();
            geom = std::make_unique<geometry::TriaO1>(node_coords);
            break;
          case GMshFileV4::ElementType::TRIA6:
            ref_el = base::RefEl::kTria();
            geom = std::make_unique<geometry::TriaO2>(node_coords);
            break;
          case GMshFileV4::ElementType::QUAD4:
            ref_el = base::RefEl::kQuad();
            geom = std::make_unique<geometry::QuadO1>(node_coords);
            break;
          case GMshFileV4::ElementType::QUAD8:
            ref_el = base::RefEl::kQuad();
            geom = std::make_unique<geometry::QuadO2>(node_coords);
            break;
          case GMshFileV4::ElementType::QUAD9:
            ref_el = base::RefEl::kQuad();
            geom = std::make_unique<geometry::QuadO2>(node_coords.leftCols(8));
            break;
          default:
            LF_VERIFY_MSG(false, "Gmsh element type "
                                     << element_block.element_type
                                     << " not (yet) supported by GmshReader.");
        }
        std::vector<size_type> main_nodes(ref_el.NumNodes());
        for (dim_t i = 0; i < ref_el.NumNodes(); ++i) {
          main_nodes[i] = gi2mi[end_element.second[i] - min_node_tag];
        }

        mesh_factory_->AddEntity(ref_el, main_nodes, std::move(geom));
        mi2gi[codim].push_back(std::vector<std::size_t>{ebi});
      }
    }
  }

  // 4) Construct mesh
  /////////////////////////////////////////////////////////////////////////////
  mesh_ = mesh_factory_->Build();

  // 5) Create a mapping gmsh entity -> physical entity
  /////////////////////////////////////////////////////////////////////////////

  // GMsh Entity index to GMsh physical entity index.
  // gmei2gphi[c][i] contains all physical entity tags that belong to entity
  // with tag i and codim c
  std::array<std::vector<std::vector<int>>, 4> gmei2gmphi;

  auto makeMap = [](std::vector<std::vector<int>>& result, auto& entities) {
    // find largest entity tag:
    int max_entity_tag = 0;
    for (auto& e : entities) {
      max_entity_tag = std::max(max_entity_tag, e.tag);
    }
    result.resize(max_entity_tag + 1);

    // build map:
    for (auto& e : entities) {
      result[e.tag] = e.physical_tags;
    }
  };

  if (msh_file.partitioned_entities.num_partitions == 0) {
    makeMap(gmei2gmphi[dim_mesh], std::get<0>(msh_file.entities));
    makeMap(gmei2gmphi[dim_mesh - 1], std::get<1>(msh_file.entities));
    makeMap(gmei2gmphi[dim_mesh - 2], std::get<2>(msh_file.entities));
    if (dim_mesh == 3) {
      makeMap(gmei2gmphi[0], std::get<3>(msh_file.entities));
    }
  } else {
    makeMap(gmei2gmphi[dim_mesh],
            std::get<0>(msh_file.partitioned_entities.partitioned_entities));
    makeMap(gmei2gmphi[dim_mesh - 1],
            std::get<1>(msh_file.partitioned_entities.partitioned_entities));
    makeMap(gmei2gmphi[dim_mesh - 2],
            std::get<2>(msh_file.partitioned_entities.partitioned_entities));
    if (dim_mesh == 3) {
      makeMap(gmei2gmphi[0],
              std::get<3>(msh_file.partitioned_entities.partitioned_entities));
    }
  }

  // 6) Build MeshDataSet that assigns the physical entitiies:
  /////////////////////////////////////////////////////////////////////////////
  physical_nrs_ =
      mesh::utils::make_AllCodimMeshDataSet<std::vector<size_type>>(mesh_);

  for (dim_t c = 0; c <= dim_mesh; ++c) {
    for (const auto* e : mesh_->Entities(c)) {
      auto mi = mesh_->Index(*e);
      if (c == dim_mesh && mi >= mi2gi[dim_mesh].size()) {
        // this point did not appear as a gmsh element in the file -> don't
        // assign any physical entity nr.
        continue;
      }
      if (mi2gi[c].size() > mi) {
        std::vector<size_type> temp;
        for (auto& gmsh_index : mi2gi[c][mi]) {
          const auto& element_block =
              msh_file.elements.element_blocks[gmsh_index];
          auto& physical_tags = gmei2gmphi[c][element_block.entity_tag];
          temp.insert(std::end(temp), std::begin(physical_tags),
                      std::end(physical_tags));
        }

        physical_nrs_->operator()(*e) = std::move(temp);
      }
    }
  }

  // 7) Create mapping physicalEntityNr <-> physicalEntityName:
  //////////////////////////////////////////////////////////////////////////

  for (const auto& pn : msh_file.physical_names) {
    name_2_nr_.insert(std::pair{
        pn.name, std::pair{pn.physical_tag, dim_mesh - pn.dimension}});
    nr_2_name_.insert(std::pair{pn.physical_tag,
                                std::pair{pn.name, dim_mesh - pn.dimension}});
  }

  if (!msh_file.periodic_links.empty()) {
    /*LOGGER_ENTRY(logger_,
                 "WARNING: GMSH File  contains periodic boundary relations "
                 "between elements. These are ignored by GmshReader.",
                 3);*/
  }
}